

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O1

Reg __thiscall backend::codegen::RegAllocator::get_collapse_reg(RegAllocator *this,Reg r)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  
  uVar1 = (this->reg_collapse)._M_h._M_bucket_count;
  do {
    uVar5 = (ulong)r % uVar1;
    p_Var2 = (this->reg_collapse)._M_h._M_buckets[uVar5];
    p_Var3 = (__node_base_ptr)0x0;
    if ((p_Var2 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var2, p_Var6 = p_Var2->_M_nxt, *(uint *)&p_Var2->_M_nxt[1]._M_nxt != r)) {
      while (p_Var4 = p_Var6->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var3 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar1 != uVar5) ||
           (p_Var3 = p_Var6, p_Var6 = p_Var4, *(uint *)&p_Var4[1]._M_nxt == r)) goto LAB_0017c238;
      }
      p_Var3 = (__node_base_ptr)0x0;
    }
LAB_0017c238:
    if (p_Var3 == (__node_base_ptr)0x0) {
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var3->_M_nxt;
    }
    if (p_Var4 == (_Hash_node_base *)0x0) {
      return r;
    }
    r = *(uint *)((long)&p_Var4[1]._M_nxt + 4);
  } while( true );
}

Assistant:

Reg get_collapse_reg(Reg r) {
    auto rd = reg_collapse.find(r);
    if (rd == reg_collapse.end())
      return r;
    else
      return get_collapse_reg(rd->second);
  }